

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlEntityDesc * htmlEntityLookup(xmlChar *name)

{
  htmlEntityDesc *phVar1;
  int iVar2;
  htmlEntityDesc *phVar3;
  long lVar4;
  
  lVar4 = 0xfe;
  phVar3 = (htmlEntityDesc *)&html40ElementTable[0x5e].attrs_req;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      return (htmlEntityDesc *)0x0;
    }
    phVar1 = phVar3 + 1;
    phVar3 = phVar3 + 1;
    iVar2 = xmlStrEqual(name,(xmlChar *)phVar1->name);
  } while (iVar2 == 0);
  return phVar3;
}

Assistant:

const htmlEntityDesc *
htmlEntityLookup(const xmlChar *name) {
    unsigned int i;

    for (i = 0;i < (sizeof(html40EntitiesTable)/
                    sizeof(html40EntitiesTable[0]));i++) {
        if (xmlStrEqual(name, BAD_CAST html40EntitiesTable[i].name)) {
            return((htmlEntityDescPtr) &html40EntitiesTable[i]);
	}
    }
    return(NULL);
}